

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

bool __thiscall pbrt::SquareMatrix<2>::operator<(SquareMatrix<2> *this,SquareMatrix<2> *m2)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar7 = 0;
    bVar3 = true;
    do {
      bVar6 = bVar3;
      fVar1 = this->m[lVar5][lVar7];
      fVar2 = m2->m[lVar5][lVar7];
      if (fVar1 != fVar2) goto LAB_002fe7be;
      lVar7 = 1;
      bVar3 = false;
    } while (bVar6);
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
LAB_002fe7be:
  return fVar1 < fVar2;
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }